

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  pointer pLVar1;
  size_t __n;
  ulong uVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  undefined8 in_RAX;
  string *psVar6;
  char *pcVar7;
  pointer pLVar8;
  pointer pcVar9;
  undefined4 uStack_38;
  char space [3];
  
  pFVar3 = _stderr;
  _uStack_38 = in_RAX;
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  fprintf(pFVar3,"target [%s] links to:\n",(psVar6->_M_dataplus)._M_p);
  uVar2 = _uStack_38 >> 0x30;
  _uStack_38 = CONCAT24(0x2020,uStack_38);
  _uStack_38 = CONCAT26((short)uVar2,_uStack_38) & 0xff00ffffffffffff;
  pLVar8 = (this->FinalLinkEntries).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->FinalLinkEntries).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar8 != pLVar1) {
    iVar4 = 2;
    do {
      pFVar3 = _stderr;
      if (pLVar8->Kind == Group) {
        iVar4 = std::__cxx11::string::compare((char *)pLVar8);
        pcVar7 = "end";
        if (iVar4 == 0) {
          pcVar7 = "start";
        }
        fprintf(pFVar3,"  %s group",pcVar7);
        iVar4 = std::__cxx11::string::compare((char *)pLVar8);
        iVar4 = (uint)(iVar4 == 0) * 2 + 2;
      }
      else {
        if (pLVar8->Target == (cmGeneratorTarget *)0x0) {
          pcVar9 = (pLVar8->Item).Value._M_dataplus._M_p;
          pcVar7 = "%*sitem [%s]";
        }
        else {
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar8->Target);
          pcVar9 = (psVar6->_M_dataplus)._M_p;
          pcVar7 = "%*starget [%s]";
        }
        fprintf(pFVar3,pcVar7,iVar4,space,pcVar9);
      }
      __n = (pLVar8->Feature)._M_string_length;
      if (__n == LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
        if (__n != 0) {
          pcVar9 = (pLVar8->Feature)._M_dataplus._M_p;
          iVar5 = bcmp(pcVar9,LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,__n);
          if (iVar5 != 0) goto LAB_0014890a;
        }
      }
      else {
        pcVar9 = (pLVar8->Feature)._M_dataplus._M_p;
LAB_0014890a:
        fprintf(_stderr,", feature [%s]",pcVar9);
      }
      fputc(10,_stderr);
      pLVar8 = pLVar8 + 1;
    } while (pLVar8 != pLVar1);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  char space[] = "  ";
  int count = 2;
  for (LinkEntry const& lei : this->FinalLinkEntries) {
    if (lei.Kind == LinkEntry::Group) {
      fprintf(stderr, "  %s group",
              lei.Item.Value == "<LINK_GROUP>" ? "start" : "end");
      count = lei.Item.Value == "<LINK_GROUP>" ? 4 : 2;
    } else if (lei.Target) {
      fprintf(stderr, "%*starget [%s]", count, space,
              lei.Target->GetName().c_str());
    } else {
      fprintf(stderr, "%*sitem [%s]", count, space, lei.Item.Value.c_str());
    }
    if (lei.Feature != LinkEntry::DEFAULT) {
      fprintf(stderr, ", feature [%s]", lei.Feature.c_str());
    }
    fprintf(stderr, "\n");
  }
  fprintf(stderr, "\n");
}